

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O2

float sensitivity(baseline *data,base_learner *base,example *ec)

{
  bool bVar1;
  single_learner *this;
  vw_exception *this_00;
  float fVar2;
  float fVar3;
  string local_1c8;
  stringstream __msg;
  ostream local_198;
  
  if (data->check_enabled == true) {
    bVar1 = BASELINE::baseline_enabled(ec);
    if (!bVar1) {
      fVar2 = LEARNER::learner<char,_char>::sensitivity(base,ec,0);
      return fVar2;
    }
  }
  if (data->global_only != false) {
    VW::copy_example_metadata(false,data->ec,ec);
    (data->ec->l).simple.label = (ec->l).simple.label;
    (data->ec->pred).scalar = (ec->pred).scalar;
    fVar2 = LEARNER::learner<char,_char>::sensitivity(base,data->ec,0);
    this = LEARNER::as_singleline<char,char>(base);
    LEARNER::learner<char,_example>::predict(this,data->ec,0);
    (ec->l).simple.initial = (data->ec->pred).scalar;
    fVar3 = LEARNER::learner<char,_char>::sensitivity(base,ec,0);
    return fVar3 + fVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  std::operator<<(&local_198,"sensitivity for baseline without --global_only not implemented");
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/baseline.cc"
             ,0xa9,&local_1c8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

float sensitivity(baseline& data, base_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
    return base.sensitivity(ec);

  if (!data.global_only)
    THROW("sensitivity for baseline without --global_only not implemented");

  // sensitivity of baseline term
  VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
  data.ec->l.simple.label = ec.l.simple.label;
  data.ec->pred.scalar = ec.pred.scalar;
  // cout << "before base" << endl;
  const float baseline_sens = base.sensitivity(*data.ec);
  // cout << "base sens: " << baseline_sens << endl;

  // sensitivity of residual
  as_singleline(&base)->predict(*data.ec);
  ec.l.simple.initial = data.ec->pred.scalar;
  const float sens = base.sensitivity(ec);
  // cout << " residual sens: " << sens << endl;
  return baseline_sens + sens;
}